

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkPlayer.cpp
# Opt level: O3

turn_t * __thiscall
NetworkPlayer::get_turn
          (turn_t *__return_storage_ptr__,NetworkPlayer *this,Board *board,
          vector<std::tuple<Point,_Point,_char>,_std::allocator<std::tuple<Point,_Point,_char>_>_>
          *turns,map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                 possible_moves,
          map<Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::map<Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::vector<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>,_std::allocator<std::pair<std::shared_ptr<Piece>,_std::shared_ptr<Piece>_>_>_>_>_>_>_>_>_>
          possible_play_moves,Color color,uint turn)

{
  size_t sVar1;
  char buffer [5];
  char local_45 [5];
  string local_40;
  
  read(this->m_socket,local_45,5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Turn: ",6);
  sVar1 = strlen(local_45);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_45,sVar1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  sVar1 = strlen(local_45);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,local_45,local_45 + sVar1);
  Player::string_to_turn(__return_storage_ptr__,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

turn_t NetworkPlayer::get_turn(Board &board, const vector<tuple<Point, Point, char>> &turns,
                               map<Point, set<Point>> possible_moves, map<Point, map<Point, play>> possible_play_moves,
                               Color color, unsigned int turn) {
    char buffer[5];

    // Read turn.
    read(m_socket, &buffer, 5);
    cout << "Turn: " << buffer << endl;

    // Convert and return.
    return string_to_turn(buffer);
}